

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::MILSpec::Value_ImmediateValue::ByteSizeLong(Value_ImmediateValue *this)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  
  switch(this->_oneof_case_[0]) {
  case 1:
    sVar3 = TensorValue::ByteSizeLong((this->value_).tensor_);
    break;
  case 2:
    sVar3 = TupleValue::ByteSizeLong((this->value_).tuple_);
    break;
  case 3:
    sVar3 = ListValue::ByteSizeLong((this->value_).list_);
    break;
  case 4:
    sVar3 = DictionaryValue::ByteSizeLong((this->value_).dictionary_);
    break;
  default:
    sVar3 = 0;
    goto LAB_0020b8eb;
  }
  uVar4 = (uint)sVar3 | 1;
  iVar2 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar3 = sVar3 + (iVar2 * 9 + 0x49U >> 6) + 1;
LAB_0020b8eb:
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar3;
  return sVar3;
}

Assistant:

size_t Value_ImmediateValue::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.Value.ImmediateValue)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (value_case()) {
    // .CoreML.Specification.MILSpec.TensorValue tensor = 1;
    case kTensor: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.tensor_);
      break;
    }
    // .CoreML.Specification.MILSpec.TupleValue tuple = 2;
    case kTuple: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.tuple_);
      break;
    }
    // .CoreML.Specification.MILSpec.ListValue list = 3;
    case kList: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.list_);
      break;
    }
    // .CoreML.Specification.MILSpec.DictionaryValue dictionary = 4;
    case kDictionary: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.dictionary_);
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}